

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

YamlTag_e __thiscall c4::yml::to_tag(yml *this,csubstr tag)

{
  YamlTag_e YVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  basic_substring<const_char> local_20;
  basic_substring<const_char> local_10;
  
  pcVar4 = tag.str;
  local_20.str = (char *)this;
  local_20.len = (size_t)pcVar4;
  if (pcVar4 < (char *)0x2) {
LAB_001ba657:
    pcVar4 = (char *)0x1;
    if ((char *)local_20.len == (char *)0x0) goto LAB_001ba719;
LAB_001ba665:
    if ((yml)*local_20.str == (yml)0x21) {
      return TAG_NONE;
    }
  }
  else if (*this == (yml)0x21) {
    if (this[1] == (yml)0x3c) {
      basic_substring<const_char>::basic_substring
                (&local_10,(char *)(this + 1),(size_t)(pcVar4 + -1));
      local_20.str = local_10.str;
      local_20.len = local_10.len;
      pcVar4 = (char *)local_10.len;
      if (local_10.len < (char *)0x2) goto LAB_001ba657;
    }
    local_20.len = (size_t)pcVar4;
    if ((yml)*local_20.str == (yml)0x21) {
      if (*(yml *)(local_20.str + 1) == (yml)0x21) {
        basic_substring<const_char>::basic_substring
                  (&local_10,(char *)(local_20.str + 2),(size_t)(pcVar4 + -2));
        goto LAB_001ba6f9;
      }
      goto LAB_001ba665;
    }
  }
  if (pcVar4 < (char *)0x12) goto LAB_001ba719;
  lVar3 = 0;
  do {
    if (*(yml *)(local_20.str + lVar3) != *(yml *)("<tag:yaml.org,2002:" + lVar3 + 1)) {
      if (pcVar4 == (char *)0x12) goto LAB_001ba719;
      lVar3 = 0;
      goto LAB_001ba8f3;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x12);
  basic_substring<const_char>::basic_substring
            (&local_10,(char *)(local_20.str + 0x12),(size_t)(pcVar4 + -0x12));
  goto LAB_001ba6f9;
  while (lVar3 = lVar3 + 1, lVar3 != 0x13) {
LAB_001ba8f3:
    if (*(yml *)(local_20.str + lVar3) != *(yml *)("<tag:yaml.org,2002:" + lVar3))
    goto LAB_001ba719;
  }
  basic_substring<const_char>::basic_substring
            (&local_10,(char *)(local_20.str + 0x13),(size_t)(pcVar4 + -0x13));
  local_20.str = local_10.str;
  local_20.len = local_10.len;
  if ((char *)local_10.len == (char *)0x0) {
    return TAG_NONE;
  }
  basic_substring<const_char>::basic_substring(&local_10,local_10.str,(size_t)(local_10.len + -1));
LAB_001ba6f9:
  local_20.str = local_10.str;
  local_20.len = local_10.len;
LAB_001ba719:
  iVar2 = basic_substring<const_char>::compare(&local_20,"map",3);
  if (iVar2 == 0) {
    YVar1 = TAG_MAP;
  }
  else {
    iVar2 = basic_substring<const_char>::compare(&local_20,"omap",4);
    if (iVar2 == 0) {
      YVar1 = TAG_OMAP;
    }
    else {
      iVar2 = basic_substring<const_char>::compare(&local_20,"pairs",5);
      if (iVar2 == 0) {
        YVar1 = TAG_PAIRS;
      }
      else {
        iVar2 = basic_substring<const_char>::compare(&local_20,"set",3);
        if (iVar2 == 0) {
          YVar1 = TAG_SET;
        }
        else {
          iVar2 = basic_substring<const_char>::compare(&local_20,"seq",3);
          if (iVar2 == 0) {
            YVar1 = TAG_SEQ;
          }
          else {
            iVar2 = basic_substring<const_char>::compare(&local_20,"binary",6);
            if (iVar2 == 0) {
              YVar1 = TAG_BINARY;
            }
            else {
              iVar2 = basic_substring<const_char>::compare(&local_20,"bool",4);
              if (iVar2 == 0) {
                YVar1 = TAG_BOOL;
              }
              else {
                iVar2 = basic_substring<const_char>::compare(&local_20,"float",5);
                if (iVar2 == 0) {
                  YVar1 = TAG_FLOAT;
                }
                else {
                  iVar2 = basic_substring<const_char>::compare(&local_20,"int",3);
                  if (iVar2 == 0) {
                    YVar1 = TAG_INT;
                  }
                  else {
                    iVar2 = basic_substring<const_char>::compare(&local_20,"merge",5);
                    if (iVar2 == 0) {
                      YVar1 = TAG_MERGE;
                    }
                    else {
                      iVar2 = basic_substring<const_char>::compare(&local_20,"null",4);
                      if (iVar2 == 0) {
                        YVar1 = TAG_NULL;
                      }
                      else {
                        iVar2 = basic_substring<const_char>::compare(&local_20,"str",3);
                        if (iVar2 == 0) {
                          YVar1 = TAG_STR;
                        }
                        else {
                          iVar2 = basic_substring<const_char>::compare(&local_20,"timestamp",9);
                          if (iVar2 == 0) {
                            YVar1 = TAG_TIMESTAMP;
                          }
                          else {
                            iVar2 = basic_substring<const_char>::compare(&local_20,"value",5);
                            YVar1 = TAG_VALUE;
                            if (iVar2 != 0) {
                              YVar1 = TAG_NONE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return YVar1;
}

Assistant:

YamlTag_e to_tag(csubstr tag)
{
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("!!"))
        tag = tag.sub(2);
    else if(tag.begins_with('!'))
        return TAG_NONE;
    else if(tag.begins_with("tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("tag:yaml.org,2002:").len == 18);
        tag = tag.sub(18);
    }
    else if(tag.begins_with("<tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("<tag:yaml.org,2002:").len == 19);
        tag = tag.sub(19);
        if(!tag.len)
            return TAG_NONE;
        tag = tag.offs(0, 1);
    }

    if(tag == "map")
        return TAG_MAP;
    else if(tag == "omap")
        return TAG_OMAP;
    else if(tag == "pairs")
        return TAG_PAIRS;
    else if(tag == "set")
        return TAG_SET;
    else if(tag == "seq")
        return TAG_SEQ;
    else if(tag == "binary")
        return TAG_BINARY;
    else if(tag == "bool")
        return TAG_BOOL;
    else if(tag == "float")
        return TAG_FLOAT;
    else if(tag == "int")
        return TAG_INT;
    else if(tag == "merge")
        return TAG_MERGE;
    else if(tag == "null")
        return TAG_NULL;
    else if(tag == "str")
        return TAG_STR;
    else if(tag == "timestamp")
        return TAG_TIMESTAMP;
    else if(tag == "value")
        return TAG_VALUE;

    return TAG_NONE;
}